

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

bool __thiscall soul::Type::canBeVectorElementType(Type *this)

{
  uint uVar1;
  Primitive PVar2;
  bool bVar3;
  
  if (this->category == primitive) {
    PVar2 = (this->primitiveType).type;
    uVar1 = PVar2 - float32;
    if ((7 < uVar1) || (bVar3 = true, (0xe7U >> (uVar1 & 0x1f) & 1) == 0)) {
      bVar3 = PVar2 - complex32 < 2;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool Type::isPrimitive() const            { return category == Category::primitive; }